

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * GetDescriptorChecksum(string *descriptor)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_char> sp;
  string error;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcf;
  Span<const_char> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __a = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI);
  Span<char_const>::Span<std::__cxx11::string>
            ((Span<const_char> *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar2 = CheckChecksum(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar2) {
    std::__cxx11::string::string(this,in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(allocator<char> *)__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

std::string GetDescriptorChecksum(const std::string& descriptor)
{
    std::string ret;
    std::string error;
    Span<const char> sp{descriptor};
    if (!CheckChecksum(sp, false, error, &ret)) return "";
    return ret;
}